

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall EventLoop::loop(EventLoop *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer psVar1;
  int iVar2;
  int iVar3;
  pointer in_RCX;
  nfds_t in_RDX;
  nfds_t extraout_RDX;
  nfds_t extraout_RDX_00;
  nfds_t extraout_RDX_01;
  shared_ptr<Channel> *it;
  undefined1 auVar4 [8];
  undefined1 auVar5 [8];
  int *in_FS_OFFSET;
  vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> local_80;
  element_type *local_68;
  pointer peStack_60;
  pointer local_58;
  undefined1 auStack_48 [8];
  vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> ret;
  
  if (this->looping_ == true) {
    __assert_fail("!looping_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Ventery[P]WebServer/WebServer/EventLoop.cpp"
                  ,0x5c,"void EventLoop::loop()");
  }
  iVar3 = this->threadId_;
  iVar2 = *in_FS_OFFSET;
  if (iVar2 == 0) {
    CurrentThread::cacheTid();
    iVar2 = *in_FS_OFFSET;
    in_RDX = extraout_RDX_01;
  }
  if (iVar3 != iVar2) {
    __assert_fail("isInLoopThread()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Ventery[P]WebServer/WebServer/EventLoop.cpp"
                  ,0x5d,"void EventLoop::loop()");
  }
  this->looping_ = true;
  this->quit_ = false;
  auStack_48 = (undefined1  [8])0x0;
  ret.super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ret.super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while (psVar1 = ret.
                  super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, auVar5 = auStack_48,
        iVar3 = (int)in_RCX, this->quit_ == false) {
    auVar4 = auStack_48;
    if ((undefined1  [8])
        ret.super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>
        ._M_impl.super__Vector_impl_data._M_start != auStack_48) {
      do {
        this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&((element_type *)auVar4)->fd_)->
                  _M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          in_RDX = extraout_RDX;
        }
        iVar3 = (int)in_RCX;
        auVar4 = (undefined1  [8])&((element_type *)auVar4)->revents_;
      } while (auVar4 != (undefined1  [8])psVar1);
      ret.super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)auVar5;
    }
    Epoll::poll((Epoll *)&local_68,
                (pollfd *)
                (this->poller_).super___shared_ptr<Epoll,_(__gnu_cxx::_Lock_policy)2>._M_ptr,in_RDX,
                iVar3);
    local_80.
    super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         ret.
         super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_80.
    super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>._M_impl
    .super__Vector_impl_data._M_finish =
         ret.
         super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_80.
    super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)auStack_48;
    in_RCX = local_58;
    auStack_48 = (undefined1  [8])local_68;
    ret.super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)peStack_60;
    ret.super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_58;
    local_68 = (element_type *)0x0;
    peStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::~vector
              (&local_80);
    std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::~vector
              ((vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *)
               &local_68);
    psVar1 = ret.
             super__Vector_base<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this->eventHandling_ = true;
    for (auVar5 = auStack_48; auVar5 != (undefined1  [8])psVar1;
        auVar5 = (undefined1  [8])&((element_type *)auVar5)->revents_) {
      Channel::handleEvents
                (((__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> *)
                 &((element_type *)auVar5)->loop_)->_M_ptr);
    }
    this->eventHandling_ = false;
    doPendingFunctors(this);
    Epoll::handleExpired
              ((this->poller_).super___shared_ptr<Epoll,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    in_RDX = extraout_RDX_00;
  }
  this->looping_ = false;
  std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::~vector
            ((vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_> *)
             auStack_48);
  return;
}

Assistant:

void EventLoop::loop() { //在哪个线程建立的对象，就在哪个线程执行loop
  assert(!looping_);
  assert(isInLoopThread());
  looping_ = true;
  quit_ = false;
  // LOG_TRACE << "EventLoop " << this << " start looping";
  std::vector<SP_Channel> ret;
  while (!quit_) {
    // cout << "doing" << endl;
    ret.clear();
    ret = poller_->poll();
    eventHandling_ = true;
    for (auto& it : ret) it->handleEvents();
    eventHandling_ = false;
    doPendingFunctors();
    poller_->handleExpired();
  }
  looping_ = false;
}